

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          StringViewArg filename,DescriptorProto *message_type,FileDescriptorProto *value)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  int iVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar4;
  bool bVar5;
  int iVar6;
  
  iVar6 = *(int *)((long)&message_type->field_0 + 0x28);
  bVar5 = 0 < iVar6;
  if (0 < iVar6) {
    this_00 = &(message_type->field_0)._impl_.nested_type_;
    pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                       (&this_00->super_RepeatedPtrFieldBase,0);
    bVar2 = AddNestedExtensions(this,filename,pVVar3,value);
    if (bVar2) {
      iVar6 = 1;
      do {
        iVar1 = *(int *)((long)&message_type->field_0 + 0x28);
        bVar5 = iVar6 < iVar1;
        if (iVar1 <= iVar6) goto LAB_00f6dd79;
        pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&this_00->super_RepeatedPtrFieldBase,iVar6);
        bVar2 = AddNestedExtensions(this,filename,pVVar3,value);
        iVar6 = iVar6 + 1;
      } while (bVar2);
    }
    if (bVar5) {
      return false;
    }
  }
LAB_00f6dd79:
  iVar6 = *(int *)((long)&message_type->field_0 + 0x70);
  bVar5 = iVar6 < 1;
  if (0 < iVar6) {
    this_01 = &(message_type->field_0)._impl_.extension_;
    pVVar4 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&this_01->super_RepeatedPtrFieldBase,0);
    bVar2 = AddExtension(this,filename,pVVar4,value);
    if (bVar2) {
      iVar6 = 1;
      do {
        iVar1 = *(int *)((long)&message_type->field_0 + 0x70);
        bVar5 = iVar1 <= iVar6;
        if (iVar1 <= iVar6) {
          return bVar5;
        }
        pVVar4 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                           (&this_01->super_RepeatedPtrFieldBase,iVar6);
        bVar2 = AddExtension(this,filename,pVVar4,value);
        iVar6 = iVar6 + 1;
      } while (bVar2);
    }
  }
  return bVar5;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    StringViewArg filename, const DescriptorProto& message_type, Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}